

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O1

void __thiscall
lunasvg::Canvas::blendCanvas(Canvas *this,Canvas *canvas,BlendMode blendMode,float opacity)

{
  plutovg_matrix_t matrix;
  plutovg_matrix_t local_38;
  
  local_38.a = 1.0;
  local_38.b = 0.0;
  local_38.c = 0.0;
  local_38.d = 1.0;
  local_38.e = (float)canvas->m_x;
  local_38.f = (float)canvas->m_y;
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  plutovg_canvas_set_operator(this->m_canvas,blendMode);
  plutovg_canvas_set_texture
            (this->m_canvas,canvas->m_surface,PLUTOVG_TEXTURE_TYPE_PLAIN,opacity,&local_38);
  plutovg_canvas_paint(this->m_canvas);
  return;
}

Assistant:

void Canvas::blendCanvas(const Canvas& canvas, BlendMode blendMode, float opacity)
{
    plutovg_matrix_t matrix = { 1, 0, 0, 1, static_cast<float>(canvas.x()), static_cast<float>(canvas.y()) };
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_set_operator(m_canvas, static_cast<plutovg_operator_t>(blendMode));
    plutovg_canvas_set_texture(m_canvas, canvas.surface(), PLUTOVG_TEXTURE_TYPE_PLAIN, opacity, &matrix);
    plutovg_canvas_paint(m_canvas);
}